

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.hpp
# Opt level: O3

void njoy::tools::disco::
     Record<njoy::tools::disco::Character<66u>,njoy::tools::disco::RetainCarriage>::
     read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::__cxx11::string>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *end,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sink)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  Character<66u>::
  read<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_30,(Character<66u> *)it,end,in_RCX);
  std::__cxx11::string::operator=((string *)sink,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void read( Iterator& it, const Iterator& end, SinkType& sink, Args&... args ) {

    sink = Component::template read< SinkType >( it, end );
    Subrecord::read( it, end, args... );
  }